

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeTetra>::GetInterpolationOrder
          (TPZCompElH1<pzshape::TPZShapeTetra> *this,TPZVec<int> *ord)

{
  byte bVar1;
  TPZConnect *this_00;
  uint *puVar2;
  TPZVec<int> *in_RSI;
  long *in_RDI;
  int i;
  int local_14;
  
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,0xb);
  for (local_14 = 0; local_14 < 0xb; local_14 = local_14 + 1) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_14 + 4);
    bVar1 = TPZConnect::Order(this_00);
    puVar2 = (uint *)TPZVec<int>::operator[](in_RSI,(long)local_14);
    *puVar2 = (uint)bVar1;
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::GetInterpolationOrder(TPZVec<int> &ord) {
	ord.Resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
	int i;
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
}